

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dhm.c
# Opt level: O3

int mbedtls_dhm_parse_dhmfile(mbedtls_dhm_context *dhm,char *path)

{
  int iVar1;
  FILE *__stream;
  size_t __n;
  uchar *dhmin;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  
  __stream = fopen(path,"rb");
  iVar1 = -0x3480;
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    __n = ftell(__stream);
    if (__n == 0xffffffffffffffff) {
      fclose(__stream);
    }
    else {
      fseek(__stream,0,0);
      dhmin = (uchar *)calloc(1,__n + 1);
      if (dhmin == (uchar *)0x0) {
        fclose(__stream);
        iVar1 = -0x3400;
      }
      else {
        sVar2 = fread(dhmin,1,__n,__stream);
        fclose(__stream);
        if (sVar2 == __n) {
          dhmin[__n] = '\0';
          pcVar3 = strstr((char *)dhmin,"-----BEGIN ");
          sVar2 = __n + 1;
          if (pcVar3 == (char *)0x0) {
            sVar2 = __n;
          }
          iVar1 = mbedtls_dhm_parse_dhm(dhm,dhmin,sVar2);
          if (sVar2 != 0) {
            sVar4 = 0;
            do {
              dhmin[sVar4] = '\0';
              sVar4 = sVar4 + 1;
            } while (sVar2 != sVar4);
          }
        }
        free(dhmin);
      }
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_dhm_parse_dhmfile( mbedtls_dhm_context *dhm, const char *path )
{
    int ret;
    size_t n;
    unsigned char *buf;

    if( ( ret = load_file( path, &buf, &n ) ) != 0 )
        return( ret );

    ret = mbedtls_dhm_parse_dhm( dhm, buf, n );

    mbedtls_zeroize( buf, n );
    mbedtls_free( buf );

    return( ret );
}